

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
ptc::osout<char>(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                 *__return_storage_ptr__,basic_ostream<char,_std::char_traits<char>_> *os)

{
  basic_streambuf<char,_std::char_traits<char>_> *sbuf_00;
  savebuf<char> sbuf;
  Print<char> printer;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_288;
  undefined1 local_268 [104];
  Print<char> local_200;
  ostringstream local_198 [376];
  
  Print<char>::Print(&local_200);
  sbuf_00 = *(basic_streambuf<char,_std::char_traits<char>_> **)
             (&os->field_0xe8 + (long)os->_vptr_basic_ostream[-3]);
  std::__cxx11::ostringstream::ostringstream(local_198);
  savebuf<char>::savebuf((savebuf<char> *)local_268,sbuf_00);
  std::ios::rdbuf((streambuf *)((long)&os->_vptr_basic_ostream + (long)os->_vptr_basic_ostream[-3]))
  ;
  std::__cxx11::stringbuf::str();
  Print<char>::print_backend<std::ostream&,std::__cxx11::string>(&local_200,os,&bStack_288);
  std::__cxx11::string::~string((string *)&bStack_288);
  std::ios::rdbuf((streambuf *)((long)&os->_vptr_basic_ostream + (long)os->_vptr_basic_ostream[-3]))
  ;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(local_268 + 0x48));
  savebuf<char>::~savebuf((savebuf<char> *)local_268);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  Print<char>::~Print(&local_200);
  return __return_storage_ptr__;
}

Assistant:

inline const std::basic_string<T> osout( std::basic_ostream<T>& os = select_cout<T>::cout, const Args&... args )
   {
    Print<T> printer;
    std::basic_streambuf<T>* buf = os.rdbuf();
    std::basic_ostringstream<T> str;

    savebuf<T> sbuf( buf );
    os.rdbuf( &sbuf );

    ( ( str << args << printer.getSep() ), ... );
    printer( os, str.str() );
    os.rdbuf( buf );
    return sbuf.str();
   }